

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobject.cpp
# Opt level: O2

optional<unsigned_long_long> __thiscall QMetaEnum::value64(QMetaEnum *this,int index)

{
  _Storage<unsigned_long_long,_true> in_RAX;
  undefined8 extraout_RDX;
  undefined8 uVar1;
  optional<unsigned_long_long> oVar2;
  optional<unsigned_long_long> oVar3;
  
  uVar1 = 0;
  if (-1 < index) {
    if (this->mobj != (QMetaObject *)0x0) {
      in_RAX = (_Storage<unsigned_long_long,_true>)(this->data).d;
      if ((int)*(uint *)(in_RAX._M_value + 0xc) <= index) goto LAB_00262860;
      in_RAX._M_value = value_helper<>(this,index);
      uVar1 = CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
    }
    oVar2.super__Optional_base<unsigned_long_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long_long>._8_8_ = uVar1;
    oVar2.super__Optional_base<unsigned_long_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long_long>._M_payload._M_value = in_RAX._M_value;
    return (optional<unsigned_long_long>)
           oVar2.super__Optional_base<unsigned_long_long,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_long_long>;
  }
LAB_00262860:
  oVar3.super__Optional_base<unsigned_long_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long_long>._8_8_ = 0;
  oVar3.super__Optional_base<unsigned_long_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long_long>._M_payload._M_value = in_RAX._M_value;
  return (optional<unsigned_long_long>)
         oVar3.super__Optional_base<unsigned_long_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long_long>;
}

Assistant:

std::optional<quint64> QMetaEnum::value64(int index) const
{
    if (!mobj)
        return std::nullopt;
    if (index < 0 || index >= int(data.keyCount()))
        return std::nullopt;

    return value_helper(index);
}